

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_iterator.hpp
# Opt level: O1

void __thiscall
burst::
intersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
::faze(intersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
       *this)

{
  int *piVar1;
  int *piVar2;
  iterator_range<const_int_*> *piVar3;
  iterator_range<const_int_*> *piVar4;
  iterator_range<const_int_*> *piVar5;
  int *piVar6;
  iterator_range<const_int_*> __tmp;
  
  piVar3 = (this->m_begin)._M_current;
  piVar4 = piVar3;
  piVar5 = piVar3;
  if ((this->m_end)._M_current != piVar3) {
    do {
      piVar6 = (piVar3->
               super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
               ).
               super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
               .m_Begin + 1;
      (piVar3->super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
      ).super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.m_Begin
           = piVar6;
      if (piVar6 == (piVar3->
                    super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                    ).
                    super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                    .
                    super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                    .m_End) {
        (this->m_end)._M_current = (this->m_begin)._M_current;
        return;
      }
      piVar1 = (piVar5->
               super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
               ).
               super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
               .m_Begin;
      if (piVar1 == (piVar5->
                    super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                    ).
                    super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                    .
                    super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                    .m_End) {
        __assert_fail("!empty()","/usr/include/boost/range/iterator_range_core.hpp",0xff,
                      "reference boost::iterator_range_detail::iterator_range_base<const int *, boost::iterators::incrementable_traversal_tag>::front() const [IteratorT = const int *, TraversalTag = boost::iterators::incrementable_traversal_tag]"
                     );
      }
      piVar4 = piVar3;
      if (*piVar6 <= *piVar1) {
        piVar4 = piVar5;
      }
      piVar3 = piVar3 + 1;
      piVar5 = piVar4;
    } while (piVar3 != (this->m_end)._M_current);
  }
  piVar3 = (this->m_end)._M_current;
  piVar6 = (piVar4->
           super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
           super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
           super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
           m_Begin;
  piVar1 = (piVar4->
           super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
           super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
           super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
           m_End;
  piVar2 = piVar3[-1].
           super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>.
           super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
           super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
           m_End;
  (piVar4->super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
  super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
  super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.m_Begin =
       piVar3[-1].
       super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>.
       super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
       super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.m_Begin
  ;
  (piVar4->super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
  super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
  super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.m_End =
       piVar2;
  piVar3[-1].super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>.
  super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
  super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.m_Begin =
       piVar6;
  piVar3[-1].super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>.
  super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
  super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.m_End =
       piVar1;
  return;
}

Assistant:

void faze ()
        {
            auto max_range = m_begin;
            for (auto range = m_begin; range != m_end; ++range)
            {
                range->advance_begin(1);
                if (range->empty())
                {
                    scroll_to_end();
                    return;
                }
                else if (m_compare(max_range->front(), range->front()))
                {
                    max_range = range;
                }
            }
            std::iter_swap(max_range, std::prev(m_end));
        }